

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::sgd::eval(sgd *this,vec3 *wi,vec3 *wo,void *param_3)

{
  undefined4 uVar1;
  undefined4 uVar3;
  double dVar2;
  double dVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  impl *piVar7;
  vec3 *wi_00;
  long lVar8;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar9;
  float fVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar11;
  value_type vVar12;
  vec3 vVar13;
  value_type F;
  value_type D;
  value_type G;
  vec3 local_98;
  undefined4 uStack_8c;
  double local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  float local_70;
  undefined1 local_68 [24];
  void *local_50;
  undefined1 local_48 [16];
  
  if ((wo->z <= 0.0) || (*(float *)((long)param_3 + 8) <= 0.0)) {
    (**(code **)(*(long *)wi + 0x10))(this,wi);
    pfVar9 = extraout_RDX_00;
  }
  else {
    uVar1 = wo->x;
    uVar3 = wo->y;
    local_98.x = (float)*param_3 + (float)uVar1;
    local_98.y = (float)((ulong)*param_3 >> 0x20) + (float)uVar3;
    local_98.z = wo->z + *(float *)((long)param_3 + 8);
    vVar13 = normalize(&local_98);
    local_78 = vVar13._0_8_;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = local_78;
    local_48._12_4_ = extraout_XMM0_Dd;
    lVar8 = *(long *)&wi[1].y;
    dVar2 = *(double *)(lVar8 + 0x38);
    local_88 = (double)CONCAT44((float)*(double *)(lVar8 + 0x30),(float)*(double *)(lVar8 + 0x28));
    uStack_80 = 0;
    local_70 = vVar13.z;
    puVar5 = (undefined8 *)operator_new(0xc);
    *puVar5 = local_88;
    *(float *)(puVar5 + 1) = (float)dVar2;
    lVar8 = *(long *)&wi[1].y;
    dVar2 = *(double *)(lVar8 + 0x10);
    dVar4 = *(double *)(lVar8 + 0x18);
    local_88 = *(double *)(lVar8 + 0x20);
    puVar6 = (undefined8 *)operator_new(0xc);
    *puVar6 = CONCAT44((float)dVar4,(float)dVar2);
    *(float *)(puVar6 + 1) = (float)local_88;
    fVar10 = vVar13.z * wo->z + wo->x * local_48._0_4_ + local_48._4_4_ * wo->y;
    fVar11 = 0.0;
    if (0.0 <= fVar10) {
      fVar11 = fVar10;
    }
    fVar10 = 1.0;
    if (fVar11 <= 1.0) {
      fVar10 = fVar11;
    }
    (**(code **)(**(long **)&wi->z + 0x20))(fVar10,&local_98);
    gaf((sgd *)(local_68 + 0x10),wi,wi_00,wo);
    ndf((sgd *)local_68,wi);
    fVar11 = wo->z;
    fVar10 = *(float *)((long)param_3 + 8);
    (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)0x3;
    piVar7 = (impl *)operator_new(0xc);
    (this->m_fresnel).m_f = piVar7;
    lVar8 = 0;
    do {
      *(float *)((long)&piVar7->_vptr_impl + lVar8) =
           ((*(float *)(CONCAT44(uStack_8c,local_98.z) + lVar8) *
             *(float *)((long)(_func_int ***)local_68._8_8_ + lVar8) *
             *(float *)((long)local_50 + lVar8) * *(float *)((long)puVar5 + lVar8)) /
            (fVar11 * fVar10) + *(float *)((long)puVar6 + lVar8)) / 3.1415927;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0xc);
    operator_delete((void *)local_68._8_8_);
    operator_delete(local_50);
    operator_delete((void *)CONCAT44(uStack_8c,local_98.z));
    operator_delete(puVar6);
    operator_delete(puVar5);
    pfVar9 = extraout_RDX;
  }
  vVar12._M_data = pfVar9;
  vVar12._M_size = (size_t)this;
  return vVar12;
}

Assistant:

brdf::value_type
sgd::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	if (wi.z > 0 && wo.z > 0) {
		vec3 wh = normalize(wi + wo);
		const brdf::value_type Ks = {
		    (float_t)m_data->rhoS[0],
		    (float_t)m_data->rhoS[1],
		    (float_t)m_data->rhoS[2]
		};
		const brdf::value_type Kd = {
		    (float_t)m_data->rhoD[0],
		    (float_t)m_data->rhoD[1],
		    (float_t)m_data->rhoD[2]
		};
		brdf::value_type F = m_fresnel->eval(sat(dot(wi, wh)));
		brdf::value_type G = gaf(wh, wi, wo);
		brdf::value_type D = ndf(wh);

		return ((Kd + Ks * (F * D * G) / (wi.z * wo.z)) / m_pi());
	}

	return zero_value();
}